

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

double __thiscall PFloat::GetValueFloat(PFloat *this,void *addr)

{
  void *addr_local;
  PFloat *this_local;
  
  if (((ulong)addr & (ulong)((this->super_PBasicType).super_PType.Align - 1)) != 0) {
    __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0x56e,"virtual double PFloat::GetValueFloat(void *) const");
  }
  if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 4) {
    this_local = (PFloat *)(double)*addr;
  }
  else {
    if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 != 8) {
      __assert_fail("Size == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x575,"virtual double PFloat::GetValueFloat(void *) const");
    }
    this_local = *addr;
  }
  return (double)this_local;
}

Assistant:

double PFloat::GetValueFloat(void *addr) const
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		return *(float *)addr;
	}
	else
	{
		assert(Size == 8);
		return *(double *)addr;
	}
}